

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O0

string * __thiscall
tinyusdz::Stage::dump_prim_tree_abi_cxx11_(string *__return_storage_ptr__,Stage *this)

{
  bool bVar1;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *this_00;
  uint32_t in_ECX;
  string local_1e0;
  reference local_1c0;
  Prim *root;
  const_iterator __end1;
  const_iterator __begin1;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *__range1;
  stringstream ss;
  ostream aoStack_190 [376];
  Stage *local_18;
  Stage *this_local;
  
  local_18 = this;
  this_local = (Stage *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&__range1);
  this_00 = root_prims(this);
  __end1 = std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::begin(this_00);
  root = (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                                *)&root);
    if (!bVar1) break;
    local_1c0 = __gnu_cxx::
                __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                ::operator*(&__end1);
    (anonymous_namespace)::DumpPrimTreeRec_abi_cxx11_
              (&local_1e0,(_anonymous_namespace_ *)local_1c0,(Prim *)0x0,in_ECX);
    std::operator<<(aoStack_190,(string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    __gnu_cxx::
    __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

std::string Stage::dump_prim_tree() const {
  std::stringstream ss;

  for (const Prim &root : root_prims()) {
    ss << DumpPrimTreeRec(root, 0);
  }
  return ss.str();
}